

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O1

uint64_t DecompressAmount(uint64_t x)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  if (x == 0) {
    uVar2 = 0;
  }
  else {
    uVar5 = x - 1;
    uVar1 = uVar5 / 10;
    uVar4 = uVar5 % 10;
    if (uVar4 < 9) {
      uVar1 = uVar1 % 9 + (uVar5 / 0x5a) * 10;
    }
    uVar2 = uVar1 + 1;
    if (uVar4 != 0) {
      do {
        uVar2 = uVar2 * 10;
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
      } while (uVar3 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

uint64_t DecompressAmount(uint64_t x)
{
    // x = 0  OR  x = 1+10*(9*n + d - 1) + e  OR  x = 1+10*(n - 1) + 9
    if (x == 0)
        return 0;
    x--;
    // x = 10*(9*n + d - 1) + e
    int e = x % 10;
    x /= 10;
    uint64_t n = 0;
    if (e < 9) {
        // x = 9*n + d - 1
        int d = (x % 9) + 1;
        x /= 9;
        // x = n
        n = x*10 + d;
    } else {
        n = x+1;
    }
    while (e) {
        n *= 10;
        e--;
    }
    return n;
}